

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O1

int deqp::gles31::Functional::anon_unknown_3::getNumShaderBlocks(Shader *shader,Storage storage)

{
  pointer pIVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  pIVar1 = (shader->m_defaultBlock).interfaceBlocks.
           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (int)((long)(shader->m_defaultBlock).interfaceBlocks.
                      super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 4) * 0x38e38e39;
  if ((int)uVar4 < 1) {
    return 0;
  }
  uVar5 = 0;
  iVar3 = 0;
  do {
    if (pIVar1[uVar5].storage == storage) {
      lVar2 = *(long *)&pIVar1[uVar5].dimensions.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data;
      uVar6 = (uint)((ulong)((long)*(pointer *)
                                    ((long)&pIVar1[uVar5].dimensions.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                    8) - lVar2) >> 2);
      if ((int)uVar6 < 1) {
        iVar7 = 1;
      }
      else {
        iVar7 = 1;
        uVar8 = 0;
        do {
          iVar7 = iVar7 * *(int *)(lVar2 + uVar8 * 4);
          uVar8 = uVar8 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar8);
      }
      iVar3 = iVar3 + iVar7;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != (uVar4 & 0x7fffffff));
  return iVar3;
}

Assistant:

static int getNumShaderBlocks (const ProgramInterfaceDefinition::Shader* shader, glu::Storage storage)
{
	int retVal = 0;

	for (int ndx = 0; ndx < (int)shader->getDefaultBlock().interfaceBlocks.size(); ++ndx)
	{
		if (shader->getDefaultBlock().interfaceBlocks[ndx].storage == storage)
		{
			int numInstances = 1;

			for (int dimensionNdx = 0; dimensionNdx < (int)shader->getDefaultBlock().interfaceBlocks[ndx].dimensions.size(); ++dimensionNdx)
				numInstances *= shader->getDefaultBlock().interfaceBlocks[ndx].dimensions[dimensionNdx];

			retVal += numInstances;
		}
	}

	return retVal;
}